

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_custom_notification.cxx
# Opt level: O2

ptr<force_vote_msg> __thiscall nuraft::force_vote_msg::deserialize(force_vote_msg *this,buffer *buf)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr<force_vote_msg> pVar1;
  buffer_serializer bs;
  buffer_serializer bStack_28;
  
  std::make_shared<nuraft::force_vote_msg>();
  buffer_serializer::buffer_serializer(&bStack_28,buf,LITTLE);
  buffer_serializer::get_u8(&bStack_28);
  pVar1.super___shared_ptr<nuraft::force_vote_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar1.super___shared_ptr<nuraft::force_vote_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (ptr<force_vote_msg>)
         pVar1.super___shared_ptr<nuraft::force_vote_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<force_vote_msg> force_vote_msg::deserialize(buffer& buf) {
    ptr<force_vote_msg> ret = cs_new<force_vote_msg>();
    buffer_serializer bs(buf);
    uint8_t version = bs.get_u8();
    (void)version;
    return ret;
}